

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O1

void __thiscall mathOps_trigSin_Test::TestBody(mathOps_trigSin_Test *this)

{
  double dVar1;
  char *pcVar2;
  AssertionResult gtest_ar_3;
  precise_measurement m4;
  precise_measurement m3;
  measurement m2;
  measurement m1;
  AssertHelper local_90;
  AssertHelper local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined8 uStack_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  undefined8 uStack_50;
  AssertHelper local_48;
  measurement local_40;
  measurement local_30;
  
  local_30.value_ = 0.7853981633974483;
  local_30.units_ = (unit)&DAT_2000003f800000;
  local_78 = (undefined1  [8])&DAT_2000003f800000;
  dVar1 = units::measurement::value_as(&local_30,(unit *)local_78);
  dVar1 = sin(dVar1);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_60,"sin(m1)","sin(constants::pi / 4.0)",(float)dVar1,0.70710677);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x7c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((unit)local_78 != (unit)0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_40.value_ = 45.0;
  local_40.units_.multiplier_ = 0.017453292;
  local_40.units_.base_units_ = (unit_data)0x200000;
  local_78 = (undefined1  [8])&DAT_2000003f800000;
  dVar1 = units::measurement::value_as(&local_40,(unit *)local_78);
  dVar1 = sin(dVar1);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_60,"sin(m2)","sin(constants::pi / 4.0)",(float)dVar1,0.70710677);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((unit)local_78 != (unit)0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_60 = (undefined1  [8])0x3fe921fb54442d18;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3ff0000000000000
  ;
  uStack_50._0_4_ = (unit_data)0x200000;
  uStack_50._4_4_ = 0;
  dVar1 = units::precise_measurement::value_as
                    ((precise_measurement *)local_60,(precise_unit *)units::precise::rad);
  dVar1 = sin(dVar1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_78,"sin(m3)","sin(constants::pi / 4.0)",dVar1,0.7071067811865475);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x82,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT71(local_88.data_._1_7_,local_88.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_88.data_._1_7_,local_88.data_._0_1_) + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_78._0_4_ = 0.0;
  local_78._4_4_ = (unit_data)0x40468000;
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f91df46a2529d39
  ;
  uStack_68._0_4_ = (unit_data)0x200000;
  uStack_68._4_4_ = 0;
  dVar1 = units::precise_measurement::value_as
                    ((precise_measurement *)local_78,(precise_unit *)units::precise::rad);
  dVar1 = sin(dVar1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_88,"sin(m4)","sin(constants::pi / 4.0)",dVar1,0.7071067811865475);
  if (local_88.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x85,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  return;
}

Assistant:

TEST(mathOps, trigSin)
{
    measurement m1(constants::pi / 4.0, rad);
    EXPECT_FLOAT_EQ(sin(m1), sin(constants::pi / 4.0));

    measurement m2(45.0, deg);
    EXPECT_FLOAT_EQ(sin(m2), sin(constants::pi / 4.0));

    precise_measurement m3(constants::pi / 4.0, precise::rad);
    EXPECT_DOUBLE_EQ(sin(m3), sin(constants::pi / 4.0));

    precise_measurement m4(45.0, precise::deg);
    EXPECT_DOUBLE_EQ(sin(m4), sin(constants::pi / 4.0));
}